

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool libwebm::Webm2Pes::WritePesPacket(VideoFrame *frame,PacketDataBuffer *packet_data)

{
  size_t sVar1;
  short sVar2;
  bool bVar3;
  Codec CVar4;
  Buffer *pBVar5;
  pointer puVar6;
  int64_t nanoseconds;
  reference pRVar7;
  size_t sVar8;
  unsigned_long *puVar9;
  uint8_t *fragment_start;
  size_t extra_bytes_to_copy;
  size_t bytes_copied;
  size_t bytes_to_copy;
  uint8_t *payload_start;
  BCMVHeader bcmv_header;
  size_t extra_bytes;
  Range *packet_payload_range;
  iterator __end1;
  iterator __begin1;
  Ranges *__range1;
  PesHeader header;
  int64_t khz90_pts;
  Range local_60;
  undefined4 local_4c;
  undefined1 local_46;
  bool local_45 [7];
  bool has_superframe_index;
  bool error;
  undefined1 local_38 [8];
  Ranges frame_ranges;
  PacketDataBuffer *packet_data_local;
  VideoFrame *frame_local;
  
  frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)packet_data;
  pBVar5 = VideoFrame::buffer(frame);
  puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&pBVar5->data);
  if ((puVar6 == (pointer)0x0) || (pBVar5 = VideoFrame::buffer(frame), pBVar5->length == 0)) {
    return false;
  }
  std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::vector
            ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)local_38);
  CVar4 = VideoFrame::codec(frame);
  if (CVar4 == kVP9) {
    local_45[0] = false;
    pBVar5 = VideoFrame::buffer(frame);
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&pBVar5->data);
    pBVar5 = VideoFrame::buffer(frame);
    local_46 = ParseVP9SuperFrameIndex(puVar6,pBVar5->length,(Ranges *)local_38,local_45);
    if ((local_45[0] & 1U) != 0) {
      fprintf(_stderr,"Webm2Pes: Superframe index parse failed.\n");
      frame_local._7_1_ = false;
      goto LAB_0011ad09;
    }
    if (!(bool)local_46) {
      pBVar5 = VideoFrame::buffer(frame);
      Range::Range(&local_60,0,pBVar5->length);
      std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::push_back
                ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)local_38,&local_60);
    }
  }
  else {
    pBVar5 = VideoFrame::buffer(frame);
    Range::Range((Range *)&khz90_pts,0,pBVar5->length);
    std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::push_back
              ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)local_38,
               (value_type *)&khz90_pts);
  }
  nanoseconds = VideoFrame::nanosecond_pts(frame);
  header.optional_header._288_8_ = NanosecondsTo90KhzTicks(nanoseconds);
  PesHeader::PesHeader((PesHeader *)&__range1);
  PesOptionalHeader::SetPtsBits((PesOptionalHeader *)&header,header.optional_header._288_8_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::begin
                     ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)local_38);
  packet_payload_range =
       (Range *)std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::end
                          ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)local_38);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<libwebm::Range_*,_std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>_>
                                     *)&packet_payload_range), bVar3) {
    pRVar7 = __gnu_cxx::
             __normal_iterator<libwebm::Range_*,_std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>_>
             ::operator*(&__end1);
    bcmv_header.bcmv[0] = '\0';
    bcmv_header.bcmv[1] = '\0';
    bcmv_header.bcmv[2] = '\0';
    bcmv_header.bcmv[3] = '\0';
    bcmv_header.length = 0;
    if (0x8000 < pRVar7->length) {
      bcmv_header = (BCMVHeader)(pRVar7->length - 0x8000);
    }
    sVar1 = pRVar7->offset;
    sVar8 = pRVar7->length;
    pBVar5 = VideoFrame::buffer(frame);
    if (pBVar5->length < sVar8 + sVar1) {
      fprintf(_stderr,"Webm2Pes: Invalid frame length.\n");
      frame_local._7_1_ = false;
      goto LAB_0011ad09;
    }
    sVar1 = pRVar7->length;
    sVar2 = bcmv_header.bcmv._0_2_;
    sVar8 = BCMVHeader::size();
    __range1._4_2_ = ((short)sVar1 - sVar2) + (short)sVar8;
    bVar3 = PesHeader::Write((PesHeader *)&__range1,true,
                             (PacketDataBuffer *)
                             frame_ranges.
                             super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) {
      fprintf(_stderr,"Webm2Pes: packet header write failed.\n");
      frame_local._7_1_ = false;
      goto LAB_0011ad09;
    }
    BCMVHeader::BCMVHeader((BCMVHeader *)&payload_start,(uint32_t)pRVar7->length);
    bVar3 = BCMVHeader::Write((BCMVHeader *)&payload_start,
                              (PacketDataBuffer *)
                              frame_ranges.
                              super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) {
      fprintf(_stderr,"Webm2Pes: BCMV write failed.\n");
      frame_local._7_1_ = false;
      goto LAB_0011ad09;
    }
    pBVar5 = VideoFrame::buffer(frame);
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&pBVar5->data);
    sVar1 = pRVar7->offset;
    extra_bytes_to_copy = pRVar7->length - (long)bcmv_header;
    bVar3 = CopyAndEscapeStartCodes
                      (puVar6 + sVar1,extra_bytes_to_copy,
                       (PacketDataBuffer *)
                       frame_ranges.
                       super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) {
      fprintf(_stderr,"Webm2Pes: Payload write failed.\n");
      frame_local._7_1_ = false;
      goto LAB_0011ad09;
    }
    while (bcmv_header != (BCMVHeader)0x0) {
      puVar9 = std::min<unsigned_long>(&kMaxPayloadSize,(unsigned_long *)&bcmv_header);
      sVar8 = *puVar9;
      bcmv_header = (BCMVHeader)((long)bcmv_header - sVar8);
      fragment_start._0_2_ = (short)sVar8;
      __range1._4_2_ = (short)fragment_start;
      bVar3 = PesHeader::Write((PesHeader *)&__range1,false,
                               (PacketDataBuffer *)
                               frame_ranges.
                               super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) {
        fprintf(_stderr,"Webm2pes: fragment write failed.\n");
        frame_local._7_1_ = false;
        goto LAB_0011ad09;
      }
      bVar3 = CopyAndEscapeStartCodes
                        (puVar6 + sVar1 + extra_bytes_to_copy,sVar8,
                         (PacketDataBuffer *)
                         frame_ranges.
                         super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
      if (!bVar3) {
        fprintf(_stderr,"Webm2Pes: Payload write failed.\n");
        frame_local._7_1_ = false;
        goto LAB_0011ad09;
      }
      extra_bytes_to_copy = sVar8 + extra_bytes_to_copy;
    }
    __gnu_cxx::
    __normal_iterator<libwebm::Range_*,_std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>_>
    ::operator++(&__end1);
  }
  frame_local._7_1_ = true;
LAB_0011ad09:
  local_4c = 1;
  std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::~vector
            ((vector<libwebm::Range,_std::allocator<libwebm::Range>_> *)local_38);
  return frame_local._7_1_;
}

Assistant:

bool Webm2Pes::WritePesPacket(const VideoFrame& frame,
                              PacketDataBuffer* packet_data) {
  if (frame.buffer().data.get() == nullptr || frame.buffer().length < 1)
    return false;

  Ranges frame_ranges;
  if (frame.codec() == VideoFrame::kVP9) {
    bool error = false;
    const bool has_superframe_index =
        ParseVP9SuperFrameIndex(frame.buffer().data.get(),
                                frame.buffer().length, &frame_ranges, &error);
    if (error) {
      std::fprintf(stderr, "Webm2Pes: Superframe index parse failed.\n");
      return false;
    }
    if (has_superframe_index == false) {
      frame_ranges.push_back(Range(0, frame.buffer().length));
    }
  } else {
    frame_ranges.push_back(Range(0, frame.buffer().length));
  }

  const std::int64_t khz90_pts =
      NanosecondsTo90KhzTicks(frame.nanosecond_pts());
  PesHeader header;
  header.optional_header.SetPtsBits(khz90_pts);

  packet_data->clear();

  for (const Range& packet_payload_range : frame_ranges) {
    std::size_t extra_bytes = 0;
    if (packet_payload_range.length > kMaxPayloadSize) {
      extra_bytes = packet_payload_range.length - kMaxPayloadSize;
    }
    if (packet_payload_range.length + packet_payload_range.offset >
        frame.buffer().length) {
      std::fprintf(stderr, "Webm2Pes: Invalid frame length.\n");
      return false;
    }

    // First packet of new frame. Always include PTS and BCMV header.
    header.packet_length =
        packet_payload_range.length - extra_bytes + BCMVHeader::size();
    if (header.Write(true, packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: packet header write failed.\n");
      return false;
    }

    BCMVHeader bcmv_header(static_cast<uint32_t>(packet_payload_range.length));
    if (bcmv_header.Write(packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: BCMV write failed.\n");
      return false;
    }

    // Insert the payload at the end of |packet_data|.
    const std::uint8_t* const payload_start =
        frame.buffer().data.get() + packet_payload_range.offset;

    const std::size_t bytes_to_copy = packet_payload_range.length - extra_bytes;
    if (CopyAndEscapeStartCodes(payload_start, bytes_to_copy, packet_data) ==
        false) {
      fprintf(stderr, "Webm2Pes: Payload write failed.\n");
      return false;
    }

    std::size_t bytes_copied = bytes_to_copy;
    while (extra_bytes) {
      // Write PES packets for the remaining data, but omit the PTS and BCMV
      // header.
      const std::size_t extra_bytes_to_copy =
          std::min(kMaxPayloadSize, extra_bytes);
      extra_bytes -= extra_bytes_to_copy;
      header.packet_length = extra_bytes_to_copy;
      if (header.Write(false, packet_data) != true) {
        fprintf(stderr, "Webm2pes: fragment write failed.\n");
        return false;
      }

      const std::uint8_t* fragment_start = payload_start + bytes_copied;
      if (CopyAndEscapeStartCodes(fragment_start, extra_bytes_to_copy,
                                  packet_data) == false) {
        fprintf(stderr, "Webm2Pes: Payload write failed.\n");
        return false;
      }

      bytes_copied += extra_bytes_to_copy;
    }
  }

  return true;
}